

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dns.c
# Opt level: O1

char * serilizeRr(DNSRr *dnsRr,int *length)

{
  ushort uVar1;
  void *pvVar2;
  ushort uVar3;
  ushort uVar4;
  in_addr_t iVar5;
  uint uVar6;
  char *pcVar7;
  size_t sVar8;
  char *pcVar9;
  void *pvVar10;
  DNSQuery *__src;
  DNSRr *pDVar11;
  void *pvVar12;
  ushort uVar13;
  long lVar14;
  int iVar15;
  in_addr_t *__dest;
  int *piVar16;
  int *piVar17;
  char *pcVar18;
  char *name;
  ushort *puVar19;
  ushort *dnsQuery;
  int iStack_10c;
  ushort uStack_108;
  ushort uStack_106;
  ushort uStack_104;
  ushort uStack_102;
  void *pvStack_100;
  void *pvStack_f8;
  uint uStack_ec;
  int *piStack_e8;
  char *pcStack_e0;
  char *pcStack_d8;
  char *pcStack_d0;
  DNSRr *pDStack_c8;
  char *local_40;
  
  piVar16 = length;
  pcVar7 = toInternetFormat(dnsRr->name);
  if (dnsRr->type == 1) {
    iVar15 = 4;
  }
  else {
    local_40 = toInternetFormat(dnsRr->data);
    sVar8 = strlen(local_40);
    iVar15 = (int)sVar8;
  }
  sVar8 = strlen(pcVar7);
  pcVar18 = (char *)((long)iVar15 + sVar8 + 0xe);
  pcVar9 = (char *)malloc((size_t)pcVar18);
  if (pcVar9 == (char *)0x0) {
    serilizeRr_cold_1();
    piVar17 = piVar16;
    pcVar7 = toLocalFormat(pcVar18);
    name = (char *)0x104;
    pcVar9 = (char *)malloc(0x104);
    if (pcVar9 != (char *)0x0) {
      strcpy(pcVar9,pcVar7);
      sVar8 = strlen(pcVar18);
      free(pcVar7);
      *(ushort *)(pcVar9 + 0x100) =
           *(ushort *)(pcVar18 + sVar8 + 1) << 8 | *(ushort *)(pcVar18 + sVar8 + 1) >> 8;
      *(ushort *)(pcVar9 + 0x102) =
           *(ushort *)(pcVar18 + sVar8 + 3) << 8 | *(ushort *)(pcVar18 + sVar8 + 3) >> 8;
      *piVar16 = (int)sVar8 + 5;
      return pcVar9;
    }
    deserilizeQuery_cold_1();
    piVar16 = piVar17;
    pcVar9 = toLocalFormat(name);
    puVar19 = (ushort *)0x20e;
    pcVar18 = (char *)malloc(0x20e);
    if (pcVar18 == (char *)0x0) {
      deserilizeRr_cold_1();
      if (((int *)0xb < piVar16) && (uStack_ec = (uint)puVar19[1], (puVar19[1] & 0x7078) == 0)) {
        uStack_102 = puVar19[4];
        dnsQuery = puVar19 + 6;
        pvStack_f8 = (void *)CONCAT62(pvStack_f8._2_6_,puVar19[5]);
        uVar3 = puVar19[3];
        uVar1 = *puVar19;
        uVar4 = puVar19[2];
        uVar13 = uVar4 << 8 | uVar4 >> 8;
        uStack_104 = uVar13;
        piStack_e8 = piVar17;
        pcStack_e0 = pcVar7;
        pcStack_d8 = pcVar9;
        pcStack_d0 = name;
        pDStack_c8 = dnsRr;
        if (uVar4 == 0) {
          pvVar10 = (void *)0x0;
        }
        else {
          pvStack_100 = (void *)CONCAT62(pvStack_100._2_6_,uVar3);
          pvVar10 = malloc((ulong)uVar13 * 0x100 + (ulong)uVar13 * 4);
          uVar6 = 1;
          if (1 < uVar13) {
            uVar6 = (uint)uVar13;
          }
          lVar14 = 0;
          do {
            __src = deserilizeQuery((char *)dnsQuery,&iStack_10c);
            memcpy((void *)((long)pvVar10 + lVar14),__src,0x104);
            dnsQuery = (ushort *)((long)iStack_10c + (long)dnsQuery);
            free(__src);
            lVar14 = lVar14 + 0x104;
          } while ((ulong)(uVar6 << 8) + (ulong)uVar6 * 4 != lVar14);
          uVar3 = (ushort)pvStack_100;
        }
        uVar4 = uVar3 << 8 | uVar3 >> 8;
        uStack_106 = uVar4;
        pvStack_100 = pvVar10;
        if (uVar3 == 0) {
          pvVar10 = (void *)0x0;
        }
        else {
          pvVar10 = malloc((ulong)uVar4 * 0x20c);
          uVar3 = 1;
          if (1 < uVar4) {
            uVar3 = uVar4;
          }
          lVar14 = 0;
          do {
            pDVar11 = deserilizeRr((char *)dnsQuery,&iStack_10c);
            memcpy((void *)((long)pvVar10 + lVar14),pDVar11,0x20c);
            dnsQuery = (ushort *)((long)iStack_10c + (long)dnsQuery);
            free(pDVar11);
            lVar14 = lVar14 + 0x20c;
          } while ((ulong)uVar3 * 0x20c - lVar14 != 0);
        }
        uVar3 = (ushort)pvStack_f8 << 8 | (ushort)pvStack_f8 >> 8;
        if ((ushort)pvStack_f8 == 0) {
          pvVar12 = (void *)0x0;
        }
        else {
          uStack_108 = uVar3;
          pvStack_f8 = pvVar10;
          pvVar12 = malloc((ulong)uVar3 * 0x20c);
          uVar4 = 1;
          if (1 < uVar3) {
            uVar4 = uVar3;
          }
          lVar14 = 0;
          do {
            pDVar11 = deserilizeRr((char *)dnsQuery,&iStack_10c);
            memcpy((void *)((long)pvVar12 + lVar14),pDVar11,0x20c);
            dnsQuery = (ushort *)((long)dnsQuery + (long)iStack_10c);
            free(pDVar11);
            lVar14 = lVar14 + 0x20c;
            pvVar10 = pvStack_f8;
            uVar3 = uStack_108;
          } while ((ulong)uVar4 * 0x20c - lVar14 != 0);
        }
        pvVar2 = pvStack_100;
        puVar19 = (ushort *)malloc(0x30);
        *puVar19 = uVar1 << 8 | uVar1 >> 8;
        puVar19[1] = (ushort)uStack_ec;
        puVar19[2] = uStack_104;
        puVar19[3] = uStack_106;
        puVar19[4] = uStack_102;
        puVar19[5] = uVar3;
        puVar19[6] = 0;
        puVar19[7] = 0;
        *(void **)(puVar19 + 8) = pvVar2;
        *(void **)(puVar19 + 0xc) = pvVar10;
        puVar19[0x10] = 0;
        puVar19[0x11] = 0;
        puVar19[0x12] = 0;
        puVar19[0x13] = 0;
        *(void **)(puVar19 + 0x14) = pvVar12;
        return (char *)puVar19;
      }
      return (char *)0x0;
    }
    strcpy(pcVar18,pcVar9);
    sVar8 = strlen(name);
    pcVar7 = name + sVar8;
    free(pcVar9);
    uVar3 = *(ushort *)(name + sVar8 + 1) << 8 | *(ushort *)(name + sVar8 + 1) >> 8;
    *(ushort *)(pcVar18 + 0x100) = uVar3;
    *(ushort *)(pcVar18 + 0x102) =
         *(ushort *)(name + sVar8 + 3) << 8 | *(ushort *)(name + sVar8 + 3) >> 8;
    uVar6 = *(uint *)(name + sVar8 + 5);
    *(uint *)(pcVar18 + 0x104) =
         uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
    *(ushort *)(pcVar18 + 0x108) =
         *(ushort *)(name + sVar8 + 9) << 8 | *(ushort *)(name + sVar8 + 9) >> 8;
    if (uVar3 == 0xf) {
      pcVar9 = toLocalFormat(pcVar7 + 0xd);
      strcpy(pcVar18 + 0x10a,pcVar9);
      sVar8 = strlen(pcVar7 + 0xd);
      iVar15 = (int)pcVar7 + (int)sVar8 + 0xe;
    }
    else if (uVar3 == 1) {
      pcVar9 = inet_ntoa((in_addr)*(in_addr_t *)(pcVar7 + 0xb));
      strcpy(pcVar18 + 0x10a,pcVar9);
      iVar15 = (int)pcVar7 + 0xf;
    }
    else {
      pcVar9 = name + sVar8 + 0xb;
      pcVar7 = toLocalFormat(pcVar9);
      strcpy(pcVar18 + 0x10a,pcVar7);
      sVar8 = strlen(pcVar9);
      iVar15 = (int)pcVar9 + (int)sVar8 + 1;
    }
    *piVar17 = iVar15 - (int)name;
    return pcVar18;
  }
  strcpy(pcVar9,pcVar7);
  sVar8 = strlen(pcVar7);
  free(pcVar7);
  uVar3 = dnsRr->type;
  *(ushort *)(pcVar9 + sVar8 + 1) = uVar3 << 8 | uVar3 >> 8;
  *(unsigned_short *)(pcVar9 + sVar8 + 3) = dnsRr->class << 8 | dnsRr->class >> 8;
  uVar6 = dnsRr->ttl;
  *(uint *)(pcVar9 + sVar8 + 5) =
       uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
  uVar1 = (ushort)iVar15;
  if (uVar3 == 1) {
    *(ushort *)(pcVar9 + sVar8 + 9) = uVar1 << 8 | uVar1 >> 8;
  }
  else {
    if (uVar3 == 0xf) {
      *(ushort *)(pcVar9 + sVar8 + 9) = (uVar1 + 3) * 0x100 | (ushort)(uVar1 + 3) >> 8;
      (pcVar9 + sVar8 + 0xb)[0] = '\0';
      (pcVar9 + sVar8 + 0xb)[1] = '\x05';
      lVar14 = 0xd;
      goto LAB_00101d02;
    }
    *(ushort *)(pcVar9 + sVar8 + 9) = (uVar1 + 1) * 0x100 | (ushort)(uVar1 + 1) >> 8;
  }
  lVar14 = 0xb;
LAB_00101d02:
  __dest = (in_addr_t *)(pcVar9 + lVar14 + sVar8);
  if (uVar3 == 1) {
    iVar5 = inet_addr(dnsRr->data);
    *__dest = iVar5;
  }
  else {
    memcpy(__dest,local_40,(long)(iVar15 + 1));
    free(local_40);
  }
  *length = (((int)__dest + iVar15) - (int)pcVar9) + 1;
  return pcVar9;
}

Assistant:

char *serilizeRr(DNSRr *dnsRr, int *length)
{

    char *formatedName = toInternetFormat(dnsRr->name);
    int dataLength = 0;
    char *formatedData;
    if (dnsRr->type == T_A)
    {
        dataLength = 4;
    } else
    {
        formatedData = toInternetFormat(dnsRr->data);
        dataLength = strlen(formatedData);
    }
    char *result = (char *) malloc(strlen(formatedName) + dataLength + 4 + 4 + 2 + 2 + 2);
    checkMalloc(result);

    char *ptr = result;
    strcpy(ptr, formatedName);

    ptr += strlen(formatedName) + 1;
    free(formatedName);
    *(unsigned short *) ptr = htons(dnsRr->type);
    ptr += 2;
    *(unsigned short *) ptr = htons(dnsRr->class);
    ptr += 2;
    *(unsigned int *) ptr = htonl(dnsRr->ttl);

    ptr += 4;


    if (dnsRr->type == T_MX)
    {
        *(unsigned short *) ptr = htons(dataLength + 3);
        ptr += 2;
        *(unsigned short *) ptr = htons(0x05);
        ptr += 2;
    } else if (dnsRr->type == T_A)
    {
        *(unsigned short *) ptr = htons(dataLength);
        ptr += 2;
    } else
    {
        *(unsigned short *) ptr = htons(dataLength + 1);
        ptr += 2;
    }

    if (dnsRr->type == T_A)
    {
        *(unsigned int *) ptr = inet_addr(dnsRr->data);

    } else
    {
        memcpy(ptr, formatedData, dataLength + 1);
        free(formatedData);
    }
    ptr += dataLength + 1;

    *length = ptr - result;
    return result;
}